

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm1d.c
# Opt level: O0

void av1_fadst4(int32_t *input,int32_t *output,int8_t cos_bit,int8_t *stage_range)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int n;
  int32_t iVar5;
  int32_t iVar6;
  int32_t iVar7;
  int32_t iVar8;
  int32_t iVar9;
  int32_t iVar10;
  int32_t iVar11;
  int32_t iVar12;
  int32_t *piVar13;
  int8_t *in_RCX;
  char in_DL;
  int32_t *in_RSI;
  int32_t *in_RDI;
  int32_t s7;
  int32_t s6;
  int32_t s5;
  int32_t s4;
  int32_t s3;
  int32_t s2;
  int32_t s1;
  int32_t s0;
  int32_t x3;
  int32_t x2;
  int32_t x1;
  int32_t x0;
  int32_t *sinpi;
  int bit;
  
  n = (int)in_DL;
  piVar13 = sinpi_arr(n);
  av1_range_check_buf(0,in_RDI,in_RDI,4,*in_RCX);
  iVar1 = *in_RDI;
  iVar2 = in_RDI[1];
  iVar3 = in_RDI[2];
  iVar4 = in_RDI[3];
  if (((iVar1 == 0 && iVar2 == 0) && iVar3 == 0) && iVar4 == 0) {
    in_RSI[3] = 0;
    in_RSI[2] = 0;
    in_RSI[1] = 0;
    *in_RSI = 0;
  }
  else {
    iVar5 = range_check_value(piVar13[1] * iVar1,in_DL + in_RCX[1]);
    iVar6 = range_check_value(piVar13[4] * iVar1,in_DL + in_RCX[1]);
    iVar7 = range_check_value(piVar13[2] * iVar2,in_DL + in_RCX[1]);
    iVar8 = range_check_value(piVar13[1] * iVar2,in_DL + in_RCX[1]);
    iVar9 = range_check_value(piVar13[3] * iVar3,in_DL + in_RCX[1]);
    iVar10 = range_check_value(piVar13[4] * iVar4,in_DL + in_RCX[1]);
    iVar11 = range_check_value(piVar13[2] * iVar4,in_DL + in_RCX[1]);
    iVar12 = range_check_value(iVar1 + iVar2,in_RCX[1]);
    iVar12 = range_check_value(iVar12 - iVar4,in_RCX[2]);
    iVar5 = range_check_value(iVar5 + iVar7,in_DL + in_RCX[3]);
    iVar7 = range_check_value(piVar13[3] * iVar12,in_DL + in_RCX[3]);
    iVar6 = range_check_value(iVar6 - iVar8,in_DL + in_RCX[3]);
    iVar8 = range_check_value(iVar9,in_DL + in_RCX[3]);
    iVar5 = range_check_value(iVar5 + iVar10,in_DL + in_RCX[4]);
    iVar6 = range_check_value(iVar6 + iVar11,in_DL + in_RCX[4]);
    iVar9 = range_check_value(iVar5 + iVar8,in_DL + in_RCX[5]);
    iVar7 = range_check_value(iVar7,in_DL + in_RCX[5]);
    iVar10 = range_check_value(iVar6 - iVar8,in_DL + in_RCX[5]);
    iVar5 = range_check_value(iVar6 - iVar5,in_DL + in_RCX[5]);
    iVar5 = range_check_value(iVar5 + iVar8,in_DL + in_RCX[6]);
    iVar6 = round_shift((long)iVar9,n);
    *in_RSI = iVar6;
    iVar6 = round_shift((long)iVar7,n);
    in_RSI[1] = iVar6;
    iVar6 = round_shift((long)iVar10,n);
    in_RSI[2] = iVar6;
    iVar5 = round_shift((long)iVar5,n);
    in_RSI[3] = iVar5;
    av1_range_check_buf(6,in_RDI,in_RSI,4,in_RCX[6]);
  }
  return;
}

Assistant:

void av1_fadst4(const int32_t *input, int32_t *output, int8_t cos_bit,
                const int8_t *stage_range) {
  int bit = cos_bit;
  const int32_t *sinpi = sinpi_arr(bit);
  int32_t x0, x1, x2, x3;
  int32_t s0, s1, s2, s3, s4, s5, s6, s7;

  // stage 0
  av1_range_check_buf(0, input, input, 4, stage_range[0]);
  x0 = input[0];
  x1 = input[1];
  x2 = input[2];
  x3 = input[3];

  if (!(x0 | x1 | x2 | x3)) {
    output[0] = output[1] = output[2] = output[3] = 0;
    return;
  }

  // stage 1
  s0 = range_check_value(sinpi[1] * x0, bit + stage_range[1]);
  s1 = range_check_value(sinpi[4] * x0, bit + stage_range[1]);
  s2 = range_check_value(sinpi[2] * x1, bit + stage_range[1]);
  s3 = range_check_value(sinpi[1] * x1, bit + stage_range[1]);
  s4 = range_check_value(sinpi[3] * x2, bit + stage_range[1]);
  s5 = range_check_value(sinpi[4] * x3, bit + stage_range[1]);
  s6 = range_check_value(sinpi[2] * x3, bit + stage_range[1]);
  s7 = range_check_value(x0 + x1, stage_range[1]);

  // stage 2
  s7 = range_check_value(s7 - x3, stage_range[2]);

  // stage 3
  x0 = range_check_value(s0 + s2, bit + stage_range[3]);
  x1 = range_check_value(sinpi[3] * s7, bit + stage_range[3]);
  x2 = range_check_value(s1 - s3, bit + stage_range[3]);
  x3 = range_check_value(s4, bit + stage_range[3]);

  // stage 4
  x0 = range_check_value(x0 + s5, bit + stage_range[4]);
  x2 = range_check_value(x2 + s6, bit + stage_range[4]);

  // stage 5
  s0 = range_check_value(x0 + x3, bit + stage_range[5]);
  s1 = range_check_value(x1, bit + stage_range[5]);
  s2 = range_check_value(x2 - x3, bit + stage_range[5]);
  s3 = range_check_value(x2 - x0, bit + stage_range[5]);

  // stage 6
  s3 = range_check_value(s3 + x3, bit + stage_range[6]);

  // 1-D transform scaling factor is sqrt(2).
  output[0] = round_shift(s0, bit);
  output[1] = round_shift(s1, bit);
  output[2] = round_shift(s2, bit);
  output[3] = round_shift(s3, bit);
  av1_range_check_buf(6, input, output, 4, stage_range[6]);
}